

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.h
# Opt level: O1

void __thiscall
Index::Index(Index *this,Thread *thread,vector<Comment,_std::allocator<Comment>_> *comments)

{
  _Rb_tree_header *p_Var1;
  pointer pCVar2;
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  logger *plVar3;
  Thread *container;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  Comment *comment;
  pointer newComment;
  string_view_t fmt;
  string_view delimiter;
  string_view_t fmt_00;
  string_view delimiter_00;
  string_view_t fmt_01;
  undefined1 local_a8 [8];
  vector<LinkedToken,_std::allocator<LinkedToken>_> linksfromThread;
  undefined1 auStack_88 [8];
  set<Token,_std::less<Token>,_std::allocator<Token>_> tokensfromThread;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  p_Var1 = &(this->opTokens)._M_t._M_impl.super__Rb_tree_header;
  (this->opTokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->opTokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->opTokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->opTokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_38 = &(this->threadId).field_2;
  (this->opTokens)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->links).super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->links).super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->links).super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->threadId)._M_dataplus._M_p = (pointer)local_38;
  (this->threadId)._M_string_length = 0;
  (this->threadId).field_2._M_local_buf[0] = '\0';
  linksfromThread.super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&this->links;
  plVar3 = spdlog::default_logger_raw();
  auStack_88 = (undefined1  [8])0x0;
  tokensfromThread._M_t._M_impl._0_8_ = 0;
  tokensfromThread._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tokensfromThread._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  fmt.size_ = 0x19;
  fmt.data_ = "indexing new thread id {}";
  container = thread;
  spdlog::logger::log_<std::__cxx11::string_const&>(plVar3,loc,info,fmt,&thread->id);
  Thread::extractLinks((vector<LinkedToken,_std::allocator<LinkedToken>_> *)local_a8,thread);
  delimiter._M_str = local_a8;
  delimiter._M_len = (size_t)"\n";
  ::str::join<std::vector<LinkedToken,std::allocator<LinkedToken>>>
            ((string *)auStack_88,(str *)0x1,delimiter,
             (vector<LinkedToken,_std::allocator<LinkedToken>_> *)container);
  plVar3 = spdlog::default_logger_raw();
  tokensfromThread._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48._M_allocated_capacity = 0;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_88;
  loc_00.funcname = (char *)0x0;
  loc_00.filename = (char *)0x0;
  loc_00.line = 0;
  loc_00._12_4_ = 0;
  fmt_00.size_ = 9;
  fmt_00.data_ = "links: {}";
  spdlog::logger::log_<std::__cxx11::string>(plVar3,loc_00,info,fmt_00,args);
  if (auStack_88 != (undefined1  [8])&tokensfromThread._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)auStack_88,
                    tokensfromThread._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  std::vector<LinkedToken,std::allocator<LinkedToken>>::
  _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<LinkedToken*,std::vector<LinkedToken,std::allocator<LinkedToken>>>>>
            ((vector<LinkedToken,std::allocator<LinkedToken>> *)&this->links,
             (this->links).super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>._M_impl.
             super__Vector_impl_data._M_finish,local_a8,
             linksfromThread.super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>._M_impl.
             super__Vector_impl_data._M_start);
  Thread::extractTokens((set<Token,_std::less<Token>,_std::allocator<Token>_> *)auStack_88,thread);
  delimiter_00._M_str = auStack_88;
  delimiter_00._M_len = (size_t)"\n";
  ::str::join<std::set<Token,std::less<Token>,std::allocator<Token>>>
            ((string *)&tokensfromThread._M_t._M_impl.super__Rb_tree_header._M_node_count,(str *)0x1
             ,delimiter_00,(set<Token,_std::less<Token>,_std::allocator<Token>_> *)args);
  plVar3 = spdlog::default_logger_raw();
  loc_01.funcname = (char *)0x0;
  loc_01.filename = (char *)0x0;
  loc_01.line = 0;
  loc_01._12_4_ = 0;
  fmt_01.size_ = 10;
  fmt_01.data_ = "tokens: {}";
  spdlog::logger::log_<std::__cxx11::string>
            (plVar3,loc_01,info,fmt_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &tokensfromThread._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tokensfromThread._M_t._M_impl.super__Rb_tree_header._M_node_count != &local_48) {
    operator_delete((void *)tokensfromThread._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    local_48._M_allocated_capacity + 1);
  }
  std::_Rb_tree<Token,Token,std::_Identity<Token>,std::less<Token>,std::allocator<Token>>::
  _M_insert_range_unique<std::move_iterator<std::_Rb_tree_const_iterator<Token>>>
            ((_Rb_tree<Token,Token,std::_Identity<Token>,std::less<Token>,std::allocator<Token>> *)
             this,(move_iterator<std::_Rb_tree_const_iterator<Token>_>)
                  tokensfromThread._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             (move_iterator<std::_Rb_tree_const_iterator<Token>_>)&tokensfromThread);
  pCVar2 = (comments->super__Vector_base<Comment,_std::allocator<Comment>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (newComment = (comments->super__Vector_base<Comment,_std::allocator<Comment>_>)._M_impl.
                    super__Vector_impl_data._M_start; newComment != pCVar2;
      newComment = newComment + 1) {
    addToIndex(this,newComment);
  }
  std::__cxx11::string::_M_assign((string *)&this->threadId);
  std::_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>::
  ~_Rb_tree((_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>
             *)auStack_88);
  std::vector<LinkedToken,_std::allocator<LinkedToken>_>::~vector
            ((vector<LinkedToken,_std::allocator<LinkedToken>_> *)local_a8);
  return;
}

Assistant:

Index(const Thread& thread, const std::vector<Comment>& comments) {
			spdlog::info("indexing new thread id {}", thread.id);

			std::vector<LinkedToken> linksfromThread = thread.extractLinks();
			spdlog::info("links: {}", str::join("\n", linksfromThread));
			moveInsert(std::move(linksfromThread), links);

			std::set<Token> tokensfromThread = thread.extractTokens();
			spdlog::info("tokens: {}", str::join("\n", tokensfromThread));
			moveInsert(std::move(tokensfromThread), opTokens);

			for (const Comment& comment : comments) {
				addToIndex(comment);
			}

			threadId = thread.id;
		}